

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyvalues.cpp
# Opt level: O1

void __thiscall KV::KeyValues::saveToBuffer(KeyValues *this,string *out)

{
  KeyValues *pKVar1;
  KeyValues *pKVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  anon_class_8_1_3fcf671e writeTabs;
  anon_class_16_2_01948639 writeKV;
  anon_class_16_2_b6bd5efa writeKey;
  stringstream ss;
  undefined1 local_208 [24];
  anon_class_16_2_01948639 *local_1f0;
  string *local_1e8;
  anon_class_8_1_3fcf671e local_1e0;
  anon_class_16_2_01948639 local_1d8;
  anon_class_16_2_b6bd5efa local_1c8;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  pKVar1 = this->parentKV;
  while (pKVar2 = pKVar1, pKVar2 != (KeyValues *)0x0) {
    this = pKVar2;
    pKVar1 = pKVar2->parentKV;
  }
  if ((this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_1e8 = out;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_1c8.writeTabs = &local_1e0;
    p_Var3 = (this->keyvalues)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(this->keyvalues)._M_t._M_impl.super__Rb_tree_header;
    local_1e0.ss = (stringstream *)local_1b8;
    local_1d8.writeKey = &local_1c8;
    local_1d8.ss = (stringstream *)local_1b8;
    local_1c8.ss = (stringstream *)local_1b8;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      do {
        pKVar1 = *(KeyValues **)(p_Var3 + 2);
        if ((pKVar1->value).
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == false) {
          local_208._16_8_ = &local_1e0;
          local_208._0_8_ = &local_1c8;
          local_208._8_8_ = local_1b8;
          local_1f0 = &local_1d8;
          const::{lambda(KV::KeyValues&,auto:1&)#1}::operator()
                    (local_208,pKVar1,(anon_class_32_4_cd4c352e *)local_208);
        }
        else {
          saveToBuffer::anon_class_16_2_01948639::operator()(&local_1d8,pKVar1);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)local_1e8,(string *)local_208);
    if ((anon_class_16_2_b6bd5efa *)local_208._0_8_ !=
        (anon_class_16_2_b6bd5efa *)(local_208 + 0x10)) {
      operator_delete((void *)local_208._0_8_,(ulong)((long)(stringstream **)local_208._16_8_ + 1));
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void KeyValues::saveToBuffer( std::string &out )
	{
		KeyValues &root = getRoot();

		if ( root.isEmpty() )
			return;

		std::stringstream ss;

		auto writeTabs = [ &ss ]( size_t tabDepth )
		{
			if ( tabDepth > 0 )
			{
				std::string tabs( tabDepth, '\t' );
				ss << tabs;
			}
		};

		auto writeKey = [ & ]( KeyValues &kv )
		{
			writeTabs( kv.getDepth() );
			ss << '\"' << kv.getKey() << '\"';
		};

		auto writeKV = [ & ]( KeyValues &kv )
		{
			writeKey( kv );
			ss << ' ' << '\"' << kv.getValue() << '\"' << '\n';
		};

		auto writeSectionRecursive = [ & ]( KeyValues &section ) -> void
		{
			auto writeSection = [ & ]( KeyValues &sectionKV, auto &writeFunc ) -> void
			{
				writeKey( sectionKV );

				ss << '\n';
				writeTabs( sectionKV.getDepth() );
				ss << '{' << '\n';

				for ( KeyValues &kv : sectionKV )
				{
					if ( kv.isSection() )
						writeFunc( kv, writeFunc );
					else
						writeKV( kv );
				}

				writeTabs( sectionKV.getDepth() );
				ss << '}' << '\n';

				// Write a new line if it's the end of a 'global' section
				if ( sectionKV.getDepth() == 0 )
					ss << '\n';
			};

			writeSection( section, writeSection );
		};

		for ( KeyValues &kv : root )
		{
			if ( kv.isSection() )
				writeSectionRecursive( kv );
			else
				writeKV( kv );
		}

		out = ss.str();
	}